

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIPSolution.cpp
# Opt level: O0

JointPolicyPureVectorForClusteredBG * __thiscall
BGIPSolution::GetJointPolicyPureVectorForClusteredBG(BGIPSolution *this)

{
  shared_ptr<PartialJPDPValuePair> *this_00;
  type pPVar1;
  const_reference this_01;
  long in_RDI;
  shared_ptr<PartialJointPolicyDiscretePure> *in_stack_ffffffffffffff88;
  shared_ptr<JointPolicyPureVectorForClusteredBG> *this_02;
  shared_ptr<JointPolicyPureVectorForClusteredBG> local_50 [3];
  shared_ptr<JointPolicyPureVectorForClusteredBG> local_20;
  type local_8;
  
  if ((*(byte *)(in_RDI + 0x20) & 1) == 0) {
    this_01 = std::
              priority_queue<boost::shared_ptr<PartialJPDPValuePair>,_std::vector<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
              ::top((priority_queue<boost::shared_ptr<PartialJPDPValuePair>,_std::vector<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
                     *)0x8d0e52);
    pPVar1 = boost::shared_ptr<PartialJPDPValuePair>::operator->(this_01);
    (*(pPVar1->super_PartialJointPolicyValuePair).super_PartialPolicyPoolItemInterface.
      _vptr_PartialPolicyPoolItemInterface[2])();
    boost::dynamic_pointer_cast<JointPolicyPureVectorForClusteredBG,PartialJointPolicyDiscretePure>
              (in_stack_ffffffffffffff88);
    local_8 = boost::shared_ptr<JointPolicyPureVectorForClusteredBG>::operator*(local_50);
    boost::shared_ptr<JointPolicyPureVectorForClusteredBG>::~shared_ptr
              ((shared_ptr<JointPolicyPureVectorForClusteredBG> *)0x8d0eaa);
    boost::shared_ptr<PartialJointPolicyDiscretePure>::~shared_ptr
              ((shared_ptr<PartialJointPolicyDiscretePure> *)0x8d0eb4);
  }
  else {
    this_00 = FixedCapacityPriorityQueue<boost::shared_ptr<PartialJPDPValuePair>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
              ::top((FixedCapacityPriorityQueue<boost::shared_ptr<PartialJPDPValuePair>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
                     *)0x8d0db4);
    pPVar1 = boost::shared_ptr<PartialJPDPValuePair>::operator->(this_00);
    (*(pPVar1->super_PartialJointPolicyValuePair).super_PartialPolicyPoolItemInterface.
      _vptr_PartialPolicyPoolItemInterface[2])();
    this_02 = &local_20;
    boost::dynamic_pointer_cast<JointPolicyPureVectorForClusteredBG,PartialJointPolicyDiscretePure>
              ((shared_ptr<PartialJointPolicyDiscretePure> *)this_02);
    local_8 = boost::shared_ptr<JointPolicyPureVectorForClusteredBG>::operator*(this_02);
    boost::shared_ptr<JointPolicyPureVectorForClusteredBG>::~shared_ptr
              ((shared_ptr<JointPolicyPureVectorForClusteredBG> *)0x8d0e0e);
    boost::shared_ptr<PartialJointPolicyDiscretePure>::~shared_ptr
              ((shared_ptr<PartialJointPolicyDiscretePure> *)0x8d0e18);
  }
  return local_8;
}

Assistant:

const JointPolicyPureVectorForClusteredBG& 
BGIPSolution::GetJointPolicyPureVectorForClusteredBG() const 
{
    if(_m_useFixedCapacityPriorityQueue)
        return(*boost::dynamic_pointer_cast<JointPolicyPureVectorForClusteredBG>(
                   _m_qpFixedK.top()->GetJPol()));
    else
        return(*boost::dynamic_pointer_cast<JointPolicyPureVectorForClusteredBG>(
                   _m_qpInfSize->top()->GetJPol()));
}